

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Int_t * Acec_MapMajOuts2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vRanks)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  iVar1 = p->nObjs;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar3;
  if (iVar3 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar3 << 2);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  iVar3 = vAdds->nSize;
  if (0 < iVar3) {
    iVar4 = 0;
    uVar5 = 4;
    do {
      if (iVar3 <= (int)uVar5) {
LAB_0067e1b8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = vAdds->pArray[uVar5];
      lVar7 = (long)iVar6;
      if ((lVar7 < 0) || (vRanks->nSize <= iVar6)) goto LAB_0067e1b8;
      if (vRanks->pArray[lVar7] != -1) {
        if (iVar1 <= iVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar7] = iVar4;
      }
      iVar4 = iVar4 + 1;
      iVar6 = uVar5 + 2;
      uVar5 = uVar5 + 6;
    } while (iVar6 < iVar3);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Acec_MapMajOuts2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vRanks )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vRanks, Vec_IntEntry(vAdds, 6*i+4)) != -1 )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), i );
    return vMap;
}